

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O1

wchar_t populate(chunk_conflict *c,_Bool valley)

{
  ushort uVar1;
  loc to_avoid;
  int16_t iVar2;
  uint32_t uVar3;
  wchar_t extraout_EAX;
  int iVar4;
  undefined7 in_register_00000031;
  uint32_t m;
  bool bVar5;
  
  iVar4 = c->depth;
  uVar3 = iVar4 / 2;
  if ((int)CONCAT71(in_register_00000031,valley) == 0) {
    m = uVar3 + 10;
    bVar5 = SBORROW4(iVar4,0x29);
    iVar4 = iVar4 + -0x29;
  }
  else {
    bVar5 = SBORROW4(uVar3,0x1e);
    iVar4 = uVar3 - 0x1e;
    m = 0x1e;
  }
  if (bVar5 != iVar4 < 0) {
    m = uVar3;
  }
  uVar1 = z_info->level_monster_min;
  uVar3 = Rand_div(8);
  get_mon_num(c->depth,c->depth);
  if (0 < (int)(uVar3 + m * 2 + (uint)uVar1 + 1)) {
    iVar4 = uVar3 + m * 2 + (uint)uVar1 + 2;
    do {
      iVar4 = iVar4 + -1;
      if (iVar4 < 5) {
        get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
        get_mon_num(c->depth,c->depth);
      }
      to_avoid.x = (player->grid).x;
      to_avoid.y = (player->grid).y;
      pick_and_place_distant_monster((chunk *)c,to_avoid,L'\n',true,c->depth);
    } while (1 < iVar4);
  }
  uVar3 = Rand_div(m);
  alloc_objects(c,L'\x03',L'\x01',uVar3 + L'\x01',c->depth,'\0');
  iVar2 = Rand_normal((uint)z_info->room_item_av,3);
  alloc_objects(c,L'\x03',L'\x03',(int)iVar2,c->depth,'\x01');
  iVar2 = Rand_normal((uint)z_info->both_item_av,3);
  alloc_objects(c,L'\x03',L'\x03',(int)iVar2,c->depth,'\x01');
  iVar2 = Rand_normal((uint)z_info->both_gold_av,3);
  alloc_objects(c,L'\x03',L'\x02',(int)iVar2,c->depth,'\x01');
  return extraout_EAX;
}

Assistant:

static int populate(struct chunk *c, bool valley)
{
	int i, j;

	/* Basic "amount" */
	int k = (c->depth / 2);

	if (valley) {
		if (k > 30)
			k = 30;
	} else {
		/* Gets hairy north of the mountains */
		if (c->depth > 40)
			k += 10;
	}

	/* Pick a base number of monsters */
	i = z_info->level_monster_min + randint1(8) + k;

	/* Build the monster probability table. */
	(void) get_mon_num(c->depth, c->depth);

	/* Put some monsters in the dungeon */
	for (j = i + k; j > 0; j--) {
		/* Always have some random monsters */
		if (j < 5) {
			/* Remove all monster restrictions. */
			get_mon_num_prep(NULL);

			/* Build the monster probability table. */
			(void) get_mon_num(c->depth, c->depth);
		}

		/*
		 * Place a random monster (quickly), but not in grids marked
		 * "SQUARE_TEMP".
		 */
		(void) pick_and_place_distant_monster(c, player->grid, 10, true,
											  c->depth);
	}

	/* Place some traps in the dungeon. */
	alloc_objects(c, SET_BOTH, TYP_TRAP, randint1(k), c->depth, 0);

	/* Put some objects in rooms */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(z_info->room_item_av, 3),
				  c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(z_info->both_item_av, 3),
				 c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD, Rand_normal(z_info->both_gold_av, 3),
				 c->depth, ORIGIN_FLOOR);

	return k;
}